

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O1

void FAudioFXReverb_Reset(FAudioFXReverb *fapo)

{
  uint uVar1;
  DspReverbChannel *pDVar2;
  long lVar3;
  long lVar4;
  float **ppfVar5;
  uint32_t *puVar6;
  
  FAPOBase_Reset(&fapo->base);
  (fapo->reverb).early_delay.read_idx = 0;
  uVar1 = (fapo->reverb).early_delay.capacity;
  (fapo->reverb).early_delay.write_idx = (fapo->reverb).early_delay.delay;
  SDL_memset((fapo->reverb).early_delay.buffer,0,(ulong)uVar1 << 2);
  (fapo->reverb).apf_in[0].delay.read_idx = 0;
  uVar1 = (fapo->reverb).apf_in[0].delay.capacity;
  (fapo->reverb).apf_in[0].delay.write_idx = (fapo->reverb).apf_in[0].delay.delay;
  SDL_memset((fapo->reverb).apf_in[0].delay.buffer,0,(ulong)uVar1 << 2);
  if (0 < (fapo->reverb).reverb_channels) {
    puVar6 = &(fapo->reverb).channel[0].lpf_comb[0].comb_delay.capacity;
    ppfVar5 = &(fapo->reverb).channel[0].apf_out[0].delay.buffer;
    lVar4 = 0;
    do {
      (fapo->reverb).channel[lVar4].reverb_delay.read_idx = 0;
      uVar1 = (fapo->reverb).channel[lVar4].reverb_delay.capacity;
      (fapo->reverb).channel[lVar4].reverb_delay.write_idx =
           (fapo->reverb).channel[lVar4].reverb_delay.delay;
      SDL_memset((fapo->reverb).channel[lVar4].reverb_delay.buffer,0,(ulong)uVar1 << 2);
      lVar3 = 0;
      do {
        *(undefined4 *)((long)puVar6 + lVar3 + 8) = 0;
        *(undefined4 *)((long)puVar6 + lVar3 + 0xc) = *(undefined4 *)((long)puVar6 + lVar3 + 4);
        SDL_memset(*(undefined8 *)((long)puVar6 + lVar3 + 0x14),0,
                   (ulong)*(uint *)((long)puVar6 + lVar3) << 2);
        *(undefined8 *)((long)puVar6 + lVar3 + 0x40) = 0;
        *(undefined8 *)((long)puVar6 + lVar3 + 0x68) = 0;
        lVar3 = lVar3 + 0x78;
      } while (lVar3 != 0x3c0);
      pDVar2 = (fapo->reverb).channel + lVar4;
      (pDVar2->room_high_shelf).delay0 = 0.0;
      (pDVar2->room_high_shelf).delay1 = 0.0;
      lVar3 = 0;
      do {
        *(undefined4 *)((long)ppfVar5 + lVar3 + -0xc) = 0;
        *(undefined4 *)((long)ppfVar5 + lVar3 + -8) = *(undefined4 *)((long)ppfVar5 + lVar3 + -0x10)
        ;
        SDL_memset(*(undefined8 *)((long)ppfVar5 + lVar3),0,
                   (ulong)*(uint *)((long)ppfVar5 + lVar3 + -0x14) << 2);
        lVar3 = lVar3 + 0x28;
      } while (lVar3 != 0xa0);
      lVar4 = lVar4 + 1;
      puVar6 = puVar6 + 300;
      ppfVar5 = ppfVar5 + 0x96;
    } while (lVar4 < (fapo->reverb).reverb_channels);
  }
  return;
}

Assistant:

void FAudioFXReverb_Reset(FAudioFXReverb *fapo)
{
	int32_t i, c;
	FAPOBase_Reset(&fapo->base);

	/* Reset the cached state of the reverb filter */
	DspDelay_Reset(&fapo->reverb.early_delay);

	for (i = 0; i < REVERB_COUNT_APF_IN; i += 1)
	{
		DspAllPass_Reset(&fapo->reverb.apf_in[i]);
	}

	for (c = 0; c < fapo->reverb.reverb_channels; c += 1)
	{
		DspDelay_Reset(&fapo->reverb.channel[c].reverb_delay);

		for (i = 0; i < REVERB_COUNT_COMB; i += 1)
		{
			DspCombShelving_Reset(&fapo->reverb.channel[c].lpf_comb[i]);
		}

		DspBiQuad_Reset(&fapo->reverb.channel[c].room_high_shelf);

		for (i = 0; i < REVERB_COUNT_APF_OUT; i += 1)
		{
			DspAllPass_Reset(&fapo->reverb.channel[c].apf_out[i]);
		}
	}
}